

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

shared_ptr<aeron::archive::AeronArchive> __thiscall
aeron::archive::AeronArchive::asyncConnect(AeronArchive *this,Context *ctx)

{
  ArchiveException *this_00;
  char *pcVar1;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Context *local_18;
  Context *ctx_local;
  
  local_18 = ctx;
  ctx_local = &this->ctx_;
  this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"not implemented",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "static std::shared_ptr<AeronArchive> aeron::archive::AeronArchive::asyncConnect(const Context &)"
             ,&local_71);
  pcVar1 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
  ArchiveException::ArchiveException(this_00,&local_38,&local_70,&local_98,0x55);
  __cxa_throw(this_00,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
}

Assistant:

std::shared_ptr<AeronArchive> AeronArchive::asyncConnect(const Context& ctx) {
    throw ArchiveException("not implemented", SOURCEINFO);
}